

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

BignumCarry
mp_add_masked_integer_into
          (BignumInt *w_out,size_t rw,mp_int *a,uintmax_t b,BignumInt b_and,BignumInt b_xor,
          BignumCarry carry)

{
  BignumInt BVar1;
  uintmax_t uVar2;
  ulong uVar3;
  ulong uVar4;
  BignumInt BVar5;
  BignumDblInt ADC_temp;
  BignumInt out;
  BignumInt bword;
  BignumInt aword;
  size_t i;
  BignumInt b_xor_local;
  BignumInt b_and_local;
  uintmax_t b_local;
  mp_int *a_local;
  size_t rw_local;
  BignumInt *w_out_local;
  
  b_and_local = b;
  for (aword = 0; aword < rw; aword = aword + 1) {
    BVar1 = mp_word(a,aword);
    uVar2 = shift_right_by_one_word(b_and_local);
    uVar3 = (b_and_local ^ b_xor) & b_and;
    uVar4 = BVar1 + uVar3;
    BVar5 = uVar4 + carry;
    carry = (ulong)CARRY8(BVar1,uVar3) + (ulong)CARRY8(uVar4,carry);
    if (w_out != (BignumInt *)0x0) {
      w_out[aword] = BVar5;
    }
    b_and_local = uVar2;
  }
  return carry;
}

Assistant:

static BignumCarry mp_add_masked_integer_into(
    BignumInt *w_out, size_t rw, mp_int *a, uintmax_t b,
    BignumInt b_and, BignumInt b_xor, BignumCarry carry)
{
    for (size_t i = 0; i < rw; i++) {
        BignumInt aword = mp_word(a, i);
        BignumInt bword = b;
        b = shift_right_by_one_word(b);
        BignumInt out;
        bword = (bword ^ b_xor) & b_and;
        BignumADC(out, carry, aword, bword, carry);
        if (w_out)
            w_out[i] = out;
    }
    return carry;
}